

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandBottommost(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint nLevels;
  Abc_Ntk_t *pAVar2;
  int iVar3;
  char *pcVar4;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  Extra_UtilGetoptReset();
  nLevels = 10;
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"Nh");
    iVar3 = globalUtilOptind;
    if (iVar1 != 0x4e) {
      if (iVar1 == -1) {
        if (pAVar2 == (Abc_Ntk_t *)0x0) {
          pcVar4 = "Empty network.\n";
        }
        else {
          if (pAVar2->ntkType != ABC_NTK_STRASH) {
            pcVar4 = "Currently only works for structurally hashed circuits.\n";
LAB_0022c4b3:
            Abc_Print(-1,pcVar4);
            return 0;
          }
          if (0 < pAVar2->nObjCounts[8]) {
            pcVar4 = "Currently only works for combinational circuits.\n";
            goto LAB_0022c4b3;
          }
          pAVar2 = Abc_NtkBottommost(pAVar2,nLevels);
          if (pAVar2 != (Abc_Ntk_t *)0x0) {
            Abc_FrameReplaceCurrentNetwork(pAbc,pAVar2);
            return 0;
          }
          pcVar4 = "The command has failed.\n";
        }
        iVar3 = -1;
        goto LAB_0022c485;
      }
      goto LAB_0022c437;
    }
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
      goto LAB_0022c437;
    }
    nLevels = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar3 + 1;
    if ((int)nLevels < 0) {
LAB_0022c437:
      iVar3 = -2;
      Abc_Print(-2,"usage: bottommost [-N num] [-h]\n");
      Abc_Print(-2,"\t         replaces the current network by several of its bottommost levels\n");
      Abc_Print(-2,"\t-N num : max number of levels [default = %d]\n",(ulong)nLevels);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      pcVar4 = "\tname   : the node name\n";
LAB_0022c485:
      Abc_Print(iVar3,pcVar4);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandBottommost( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int c, nLevels;
    extern Abc_Ntk_t * Abc_NtkBottommost( Abc_Ntk_t * pNtk, int nLevels );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    nLevels = 10;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Nh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nLevels = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLevels < 0 )
                goto usage;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Currently only works for structurally hashed circuits.\n" );
        return 0;
    }

    if ( Abc_NtkLatchNum(pNtk) > 0 )
    {
        Abc_Print( -1, "Currently only works for combinational circuits.\n" );
        return 0;
    }

    pNtkRes = Abc_NtkBottommost( pNtk, nLevels );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "The command has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: bottommost [-N num] [-h]\n" );
    Abc_Print( -2, "\t         replaces the current network by several of its bottommost levels\n" );
    Abc_Print( -2, "\t-N num : max number of levels [default = %d]\n", nLevels );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\tname   : the node name\n");
    return 1;
}